

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeMahonyFilter.cpp
# Opt level: O1

bool __thiscall
iDynTree::AttitudeMahonyFilter::setInternalState
          (AttitudeMahonyFilter *this,Span<double,__1L> *stateBuffer)

{
  long lVar1;
  pointer peVar2;
  int iVar3;
  undefined4 extraout_var;
  
  lVar1 = (stateBuffer->storage_).super_extent_type<_1L>.size_;
  iVar3 = (*(this->super_IAttitudeEstimator)._vptr_IAttitudeEstimator[8])();
  if (lVar1 == CONCAT44(extraout_var,iVar3)) {
    peVar2 = (stateBuffer->storage_).data_;
    (this->m_state_mahony).m_orientation.m_data[0] = *peVar2;
    (this->m_state_mahony).m_orientation.m_data[1] = peVar2[1];
    (this->m_state_mahony).m_orientation.m_data[2] = peVar2[2];
    (this->m_state_mahony).m_orientation.m_data[3] = peVar2[3];
    (this->m_state_mahony).m_angular_velocity.m_data[0] = peVar2[4];
    (this->m_state_mahony).m_angular_velocity.m_data[1] = peVar2[5];
    (this->m_state_mahony).m_angular_velocity.m_data[2] = peVar2[6];
    (this->m_state_mahony).m_gyroscope_bias.m_data[0] = peVar2[7];
    (this->m_state_mahony).m_gyroscope_bias.m_data[1] = peVar2[8];
    (this->m_state_mahony).m_gyroscope_bias.m_data[2] = peVar2[9];
  }
  else {
    iDynTree::reportError
              ("AttitudeMahonyFilter","setInternalState","state size mismatch, using default state")
    ;
  }
  return lVar1 == CONCAT44(extraout_var,iVar3);
}

Assistant:

bool iDynTree::AttitudeMahonyFilter::setInternalState(const iDynTree::Span< double >& stateBuffer)
{
    if ((size_t)stateBuffer.size() != getInternalStateSize())
    {
        iDynTree::reportError("AttitudeMahonyFilter", "setInternalState", "state size mismatch, using default state");
        return false;
    }
    m_state_mahony.m_orientation(0) = stateBuffer(0);
    m_state_mahony.m_orientation(1) = stateBuffer(1);
    m_state_mahony.m_orientation(2) = stateBuffer(2);
    m_state_mahony.m_orientation(3) = stateBuffer(3);
    m_state_mahony.m_angular_velocity(0) = stateBuffer(4);
    m_state_mahony.m_angular_velocity(1) = stateBuffer(5);
    m_state_mahony.m_angular_velocity(2) = stateBuffer(6);
    m_state_mahony.m_gyroscope_bias(0) = stateBuffer(7);
    m_state_mahony.m_gyroscope_bias(1) = stateBuffer(8);
    m_state_mahony.m_gyroscope_bias(2) = stateBuffer(9);
    return true;
}